

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O1

void ParseDisplayBlock(DisplayBlock_t *dblock)

{
  byte bVar1;
  char *pcVar2;
  int *piVar3;
  int i;
  long lVar4;
  
  puts("   COM-HPC Display Port block:");
  bVar1 = dblock->PortNr;
  if (bVar1 < 0x20) {
    pcVar2 = &DAT_00105154 + *(int *)(&DAT_00105154 + (ulong)(bVar1 >> 4) * 4);
  }
  else {
    pcVar2 = "?";
  }
  printf("      Port %d: %s; Supported interfaces: ",(ulong)(bVar1 & 0xf),pcVar2);
  piVar3 = &DAT_00105144;
  lVar4 = 0;
  do {
    if ((dblock->Interfaces >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      printf("%s ",(long)&DAT_00105144 + (long)*piVar3);
    }
    lVar4 = lVar4 + 1;
    piVar3 = piVar3 + 1;
  } while (lVar4 != 4);
  putchar(10);
  printf("      DisplayPort version: %d.%d\n",(ulong)(dblock->DPVersion & 7),
         (ulong)(dblock->DPVersion >> 3 & 7));
  bVar1 = dblock->HDMIVersion;
  printf("      HDMI version: %d.%d%s\n",(ulong)(bVar1 & 7),(ulong)(bVar1 >> 3 & 7),
         &DAT_0010515c + *(int *)(&DAT_0010515c + (ulong)(bVar1 >> 6) * 4));
  printf("      Maximum size: %dx%d\n",(ulong)dblock->MaxWidth,(ulong)dblock->MaxHeight);
  return;
}

Assistant:

void ParseDisplayBlock(DisplayBlock_t *dblock)
{
    const char *interfaces[] =
        { "DisplayPort", "HDMI/DVI", "DSI", "eDP" };
    const char *port_types[] = { "DDI", "eDP/DSI" };
    const char *suffixes[] =
        { "", ".a", ".b", ".c" };
	printf("   COM-HPC Display Port block:\n");
	printf("      Port %d: %s; Supported interfaces: ", dblock->PortNr & 0xF, 
        (dblock->PortNr >> 4) < ARRAYSIZE(port_types) ? port_types[dblock->PortNr >> 4] : "?");
    for(int i = 0; i < 4; i++) {
        if(dblock->Interfaces & (1 << i)) {
            printf("%s ", interfaces[i]);
        }
    }
    printf("\n");
    printf("      DisplayPort version: %d.%d\n", 
        dblock->DPVersion & 7, (dblock->DPVersion >> 3) & 7);
    printf("      HDMI version: %d.%d%s\n", 
        dblock->HDMIVersion & 7, (dblock->HDMIVersion >> 3) & 7,
        suffixes[(dblock->HDMIVersion >> 6) & 3]);
    printf("      Maximum size: %dx%d\n", dblock->MaxWidth, dblock->MaxHeight);
}